

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  string *text;
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    text = &(this->tokenizer_).current_.text;
    bVar1 = io::Tokenizer::ParseInteger(text,max_value,value);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    std::operator+(&local_38,"Integer out of range (",text);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_58.field_2._M_allocated_capacity = *psVar3;
      local_58.field_2._8_8_ = plVar2[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar3;
      local_58._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_58._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
  }
  else {
    std::operator+(&local_58,"Expected integer, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_58);
    local_38.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return false;
    }
  }
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool ConsumeUnsignedInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text,
                                     max_value, value)) {
      ReportError("Integer out of range (" + tokenizer_.current().text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }